

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *warn,string *err,char *filename,char *mtl_basedir,bool trianglulate,
                     bool default_vcols_fallback)

{
  byte bVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  ostream *this_00;
  char *pcVar3;
  long in_R8;
  uint uVar4;
  char *in_R9;
  char *in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  MaterialFileReader matFileReader;
  char dirsep;
  string baseDir;
  ifstream ifs;
  stringstream errss;
  undefined1 in_stack_0000190e;
  undefined1 in_stack_0000190f;
  istream *in_stack_00001910;
  string *in_stack_00001918;
  string *in_stack_00001920;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *in_stack_00001928;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *in_stack_00001930;
  attrib_t *in_stack_00001938;
  MaterialReader *in_stack_00001950;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  char *local_498;
  allocator local_429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined4 local_404;
  string local_400 [48];
  long local_3d0 [65];
  stringstream local_1c8 [16];
  ostream local_1b8 [382];
  byte local_3a;
  byte local_39;
  char *local_38;
  long local_30;
  byte local_1;
  
  local_39 = in_stack_00000010 & 1;
  local_3a = in_stack_00000018 & 1;
  local_38 = in_R9;
  local_30 = in_R8;
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x1aa564);
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x1aa575);
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x1aa586);
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x1aa597);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::clear
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)0x1aa5a4);
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::ifstream::ifstream(local_3d0,local_38,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_3d0 + *(long *)(local_3d0[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    if (in_stack_00000008 == (char *)0x0) {
      local_498 = "";
    }
    else {
      local_498 = in_stack_00000008;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_428,local_498,&local_429);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1aa75f
                      );
    if (!bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                (&local_428);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&local_428);
      if (*pcVar3 != '/') {
        std::__cxx11::string::operator+=((string *)&local_428,'/');
      }
    }
    MaterialFileReader::MaterialFileReader
              ((MaterialFileReader *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    uVar4 = local_39 & 1;
    local_1 = LoadObj(in_stack_00001938,in_stack_00001930,in_stack_00001928,in_stack_00001920,
                      in_stack_00001918,in_stack_00001910,in_stack_00001950,(bool)in_stack_0000190f,
                      (bool)in_stack_0000190e);
    local_404 = 1;
    MaterialFileReader::~MaterialFileReader
              ((MaterialFileReader *)CONCAT44(in_stack_fffffffffffffb34,uVar4));
    std::__cxx11::string::~string((string *)&local_428);
  }
  else {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(local_1b8,"Cannot open file [");
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::operator<<((ostream *)this,local_38);
    this_00 = std::operator<<((ostream *)__str,"]");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if (local_30 != 0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this,__str);
      std::__cxx11::string::~string(local_400);
    }
    local_1 = 0;
    local_404 = 1;
  }
  std::ifstream::~ifstream(local_3d0);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return (bool)(local_1 & 1);
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *warn,
             std::string *err, const char *filename, const char *mtl_basedir,
             bool trianglulate, bool default_vcols_fallback) {
  attrib->vertices.clear();
  attrib->normals.clear();
  attrib->texcoords.clear();
  attrib->colors.clear();
  shapes->clear();

  std::stringstream errss;

  std::ifstream ifs(filename);
  if (!ifs) {
    errss << "Cannot open file [" << filename << "]" << std::endl;
    if (err) {
      (*err) = errss.str();
    }
    return false;
  }

  std::string baseDir = mtl_basedir ? mtl_basedir : "";
  if (!baseDir.empty()) {
#ifndef _WIN32
    const char dirsep = '/';
#else
    const char dirsep = '\\';
#endif
    if (baseDir[baseDir.length() - 1] != dirsep) baseDir += dirsep;
  }
  MaterialFileReader matFileReader(baseDir);

  return LoadObj(attrib, shapes, materials, warn, err, &ifs, &matFileReader,
                 trianglulate, default_vcols_fallback);
}